

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

Status __thiscall
leveldb::Version::Get(Version *this,ReadOptions *options,LookupKey *k,string *value,GetStats *stats)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  pointer __last;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  Status SVar7;
  ulong uVar8;
  undefined8 uVar9;
  Options *in_R9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  pointer ppFVar13;
  FileMetaData *pFVar14;
  undefined4 local_fc;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> tmp;
  undefined1 local_d0 [16];
  FileMetaData *f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Options *local_a8;
  ReadOptions *local_a0;
  Slice user_key;
  Slice local_88;
  char *local_78;
  size_t sStack_70;
  GetStats *local_68;
  LookupKey *local_60;
  GetStats *local_58;
  Status local_50;
  FileMetaData *tmp2;
  Slice ikey;
  
  user_key.data_ = (char *)value->_M_string_length;
  ikey.size_ = (value->field_2)._M_allocated_capacity - (long)user_key.data_;
  user_key.size_ = ikey.size_ - 8;
  plVar1 = *(long **)(*(long *)options + 0x40);
  lVar10 = 0;
  in_R9->comparator = (Comparator *)0x0;
  in_R9->create_if_missing = true;
  in_R9->error_if_exists = true;
  in_R9->paranoid_checks = true;
  in_R9->field_0xb = 0xff;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fc = 0xffffffff;
  pFVar14 = (FileMetaData *)0x0;
  local_b8._8_8_ = this;
  local_a8 = in_R9;
  local_a0 = options;
  local_60 = k;
  local_58 = stats;
  ikey.data_ = user_key.data_;
  do {
    lVar2 = *(long *)((long)options + lVar10 * 0x18 + 0x20);
    lVar11 = *(long *)((long)options + lVar10 * 0x18 + 0x28) - lVar2;
    if (lVar11 != 0) {
      uVar12 = lVar11 >> 3;
      if (lVar10 == 0) {
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
                  (&tmp,uVar12);
        uVar6 = 0;
        uVar8 = 1;
        do {
          f = *(FileMetaData **)(lVar2 + uVar6 * 8);
          local_88 = InternalKey::user_key(&f->smallest);
          iVar5 = (**(code **)(*plVar1 + 0x10))(plVar1,&user_key,&local_88);
          if (-1 < iVar5) {
            local_d0 = (undefined1  [16])InternalKey::user_key(&f->largest);
            iVar5 = (**(code **)(*plVar1 + 0x10))(plVar1,&user_key,local_d0);
            if (iVar5 < 1) {
              if (tmp.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  tmp.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
                _M_realloc_insert<leveldb::FileMetaData*const&>
                          ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                           &tmp,(iterator)
                                tmp.
                                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&f);
              }
              else {
                *tmp.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = f;
                tmp.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     tmp.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          __last = tmp.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          ppFVar13 = tmp.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar3 = uVar8 < uVar12;
          uVar6 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar3);
        if (tmp.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            tmp.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          uVar12 = (long)tmp.
                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)tmp.
                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          lVar2 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>>
                    ((__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                      )tmp.
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                      )tmp.
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                     (ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(leveldb::FileMetaData_*,_leveldb::FileMetaData_*)>)
                     0x11a556);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>>
                    ((__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                      )ppFVar13,
                     (__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                      )__last,(_Iter_comp_iter<bool_(*)(leveldb::FileMetaData_*,_leveldb::FileMetaData_*)>
                               )0x11a556);
          uVar12 = (long)tmp.
                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)tmp.
                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          ppFVar13 = tmp.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_0011a7b3;
        }
      }
      else {
        uVar4 = FindFile((InternalKeyComparator *)(*(long *)local_a0 + 0x38),
                         (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)((long)options + lVar10 * 0x18 + 0x20),&ikey);
        if (uVar4 < uVar12) {
          tmp2 = *(FileMetaData **)(lVar2 + (ulong)uVar4 * 8);
          local_88 = InternalKey::user_key(&tmp2->smallest);
          iVar5 = (**(code **)(*plVar1 + 0x10))(plVar1,&user_key,&local_88);
          uVar12 = (ulong)(-1 < iVar5);
          ppFVar13 = (FileMetaData **)0x0;
          if (-1 < iVar5) {
            ppFVar13 = &tmp2;
          }
LAB_0011a7b3:
          if (uVar12 != 0) {
            uVar6 = 0;
            uVar8 = 1;
            do {
              if ((pFVar14 != (FileMetaData *)0x0) && (local_a8->comparator == (Comparator *)0x0)) {
                local_a8->comparator = (Comparator *)pFVar14;
                local_a8->create_if_missing = (bool)(undefined1)local_fc;
                local_a8->error_if_exists = (bool)local_fc._1_1_;
                local_a8->paranoid_checks = (bool)local_fc._2_1_;
                local_a8->field_0xb = local_fc._3_1_;
              }
              pFVar14 = ppFVar13[uVar6];
              local_88.data_ = (char *)(local_88._4_8_ << 0x20);
              local_88.size_ = (size_t)plVar1;
              local_78 = user_key.data_;
              sStack_70 = user_key.size_;
              local_68 = local_58;
              TableCache::Get((TableCache *)local_d0,*(ReadOptions **)(*(long *)local_a0 + 0x30),
                              (uint64_t)local_60,pFVar14->number,(Slice *)pFVar14->file_size,&ikey,
                              (_func_void_void_ptr_Slice_ptr_Slice_ptr *)&local_88);
              SVar7.state_ = (char *)local_d0._0_8_;
              if ((FileMetaData *)local_d0._0_8_ != (FileMetaData *)0x0) {
LAB_0011a959:
                *(char **)local_b8._8_8_ = SVar7.state_;
                uVar9 = local_b8._8_8_;
                goto LAB_0011a961;
              }
              if ((int)local_88.data_ == 1) {
                SVar7.state_ = (char *)0x0;
                goto LAB_0011a959;
              }
              if ((int)local_88.data_ == 3) {
                local_d0._8_8_ = 0x12;
                local_d0._0_8_ = "corrupted key for ";
                Status::Status((Status *)&f,kCorruption,(Slice *)local_d0,&user_key);
                SVar7.state_ = (char *)f;
                goto LAB_0011a959;
              }
              if ((int)local_88.data_ == 2) {
                local_d0 = ZEXT816(0x129cb3);
                f = (FileMetaData *)0x129cb3;
                local_b8._M_allocated_capacity = 0;
                Status::Status(&local_50,kNotFound,(Slice *)local_d0,(Slice *)&f);
                SVar7.state_ = local_50.state_;
                goto LAB_0011a959;
              }
              local_fc = (undefined4)lVar10;
              bVar3 = uVar8 < uVar12;
              uVar6 = uVar8;
              uVar8 = (ulong)((int)uVar8 + 1);
            } while (bVar3);
          }
        }
      }
    }
    uVar9 = local_b8._8_8_;
    lVar10 = lVar10 + 1;
    if (lVar10 == 7) {
      local_88 = (Slice)ZEXT816(0x129cb3);
      local_d0 = ZEXT816(0x129cb3);
      Status::Status((Status *)local_b8._8_8_,kNotFound,&local_88,(Slice *)local_d0);
LAB_0011a961:
      if (tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(tmp.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return (Status)(char *)uVar9;
    }
  } while( true );
}

Assistant:

Status Version::Get(const ReadOptions& options, const LookupKey& k,
                    std::string* value, GetStats* stats) {
  Slice ikey = k.internal_key();
  Slice user_key = k.user_key();
  const Comparator* ucmp = vset_->icmp_.user_comparator();
  Status s;

  stats->seek_file = nullptr;
  stats->seek_file_level = -1;
  FileMetaData* last_file_read = nullptr;
  int last_file_read_level = -1;

  // We can search level-by-level since entries never hop across
  // levels.  Therefore we are guaranteed that if we find data
  // in a smaller level, later levels are irrelevant.
  std::vector<FileMetaData*> tmp;
  FileMetaData* tmp2;
  for (int level = 0; level < config::kNumLevels; level++) {
    size_t num_files = files_[level].size();
    if (num_files == 0) continue;

    // Get the list of files to search in this level
    FileMetaData* const* files = &files_[level][0];
    if (level == 0) {
      // Level-0 files may overlap each other.  Find all files that
      // overlap user_key and process them in order from newest to oldest.
      tmp.reserve(num_files);
      for (uint32_t i = 0; i < num_files; i++) {
        FileMetaData* f = files[i];
        if (ucmp->Compare(user_key, f->smallest.user_key()) >= 0 &&
            ucmp->Compare(user_key, f->largest.user_key()) <= 0) {
          tmp.push_back(f);
        }
      }
      if (tmp.empty()) continue;

      std::sort(tmp.begin(), tmp.end(), NewestFirst);
      files = &tmp[0];
      num_files = tmp.size();
    } else {
      // Binary search to find earliest index whose largest key >= ikey.
      uint32_t index = FindFile(vset_->icmp_, files_[level], ikey);
      if (index >= num_files) {
        files = nullptr;
        num_files = 0;
      } else {
        tmp2 = files[index];
        if (ucmp->Compare(user_key, tmp2->smallest.user_key()) < 0) {
          // All of "tmp2" is past any data for user_key
          files = nullptr;
          num_files = 0;
        } else {
          files = &tmp2;
          num_files = 1;
        }
      }
    }

    for (uint32_t i = 0; i < num_files; ++i) {
      if (last_file_read != nullptr && stats->seek_file == nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        stats->seek_file = last_file_read;
        stats->seek_file_level = last_file_read_level;
      }

      FileMetaData* f = files[i];
      last_file_read = f;
      last_file_read_level = level;

      Saver saver;
      saver.state = kNotFound;
      saver.ucmp = ucmp;
      saver.user_key = user_key;
      saver.value = value;
      s = vset_->table_cache_->Get(options, f->number, f->file_size, ikey,
                                   &saver, SaveValue);
      if (!s.ok()) {
        return s;
      }
      switch (saver.state) {
        case kNotFound:
          break;  // Keep searching in other files
        case kFound:
          return s;
        case kDeleted:
          s = Status::NotFound(Slice());  // Use empty error message for speed
          return s;
        case kCorrupt:
          s = Status::Corruption("corrupted key for ", user_key);
          return s;
      }
    }
  }

  return Status::NotFound(Slice());  // Use an empty error message for speed
}